

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_ManPoMffcSize(Gia_Man_t *p)

{
  int iVar1;
  
  Gia_ManCreateRefs(p);
  iVar1 = p->vCos->nSize;
  if (iVar1 <= p->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (0 < iVar1) {
    iVar1 = *p->vCos->pArray;
    if ((-1 < (long)iVar1) && (iVar1 < p->nObjs)) {
      iVar1 = Gia_NodeDeref_rec(p,p->pObjs + iVar1 +
                                  -(ulong)((uint)*(undefined8 *)(p->pObjs + iVar1) & 0x1fffffff));
      return iVar1;
    }
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_ManPoMffcSize( Gia_Man_t * p )
{
    Gia_ManCreateRefs( p );
    return Gia_NodeDeref_rec( p, Gia_ObjFanin0(Gia_ManPo(p, 0)) );
}